

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-ggml.cpp
# Opt level: O2

bool ggml_common_quantize_0
               (ifstream *finp,ofstream *fout,ggml_ftype ftype,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to_quant,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to_skip)

{
  uint uVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int *piVar11;
  pointer __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s_00;
  ulong uVar12;
  int32_t *piVar13;
  long lVar14;
  char *__format;
  FILE *pFVar15;
  int i;
  long lVar16;
  ulong uVar17;
  long lVar18;
  size_type __new_size;
  undefined1 uVar19;
  uint uVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ggml_ftype local_158;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  ofstream *local_148;
  undefined4 local_13c;
  ifstream *local_138;
  undefined4 local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_u8;
  int32_t ne [4];
  string name;
  vector<float,_std::allocator<float>_> data_f32;
  vector<unsigned_short,_std::allocator<unsigned_short>_> data_f16;
  vector<float,_std::allocator<float>_> work;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  undefined4 uVar20;
  
  local_158 = GGML_FTYPE_ALL_F32;
  local_148 = fout;
  switch(ftype) {
  case GGML_FTYPE_MOSTLY_Q4_0:
  case GGML_FTYPE_MOSTLY_Q4_1:
  case GGML_FTYPE_MOSTLY_Q2_K:
  case GGML_FTYPE_MOSTLY_Q3_K:
  case GGML_FTYPE_MOSTLY_Q4_K:
  case GGML_FTYPE_MOSTLY_Q5_K:
  case GGML_FTYPE_MOSTLY_Q6_K:
    local_158 = ftype;
    break;
  case GGML_FTYPE_MOSTLY_Q8_0:
    local_158 = GGML_FTYPE_MOSTLY_Q5_0;
    break;
  case GGML_FTYPE_MOSTLY_Q5_0:
    local_158 = GGML_FTYPE_MOSTLY_Q4_1_SOME_F16|GGML_FTYPE_MOSTLY_Q4_0;
    break;
  case GGML_FTYPE_MOSTLY_Q5_1:
    local_158 = GGML_FTYPE_MOSTLY_Q8_0;
    break;
  case GGML_FTYPE_UNKNOWN:
  case GGML_FTYPE_ALL_F32:
  case GGML_FTYPE_MOSTLY_F16:
  case GGML_FTYPE_MOSTLY_Q4_1_SOME_F16:
  case GGML_FTYPE_MOSTLY_IQ2_XXS:
  case GGML_FTYPE_MOSTLY_IQ2_XS:
  case GGML_FTYPE_MOSTLY_IQ3_XXS:
  case GGML_FTYPE_MOSTLY_IQ1_S:
  case GGML_FTYPE_MOSTLY_IQ4_NL:
  case GGML_FTYPE_MOSTLY_IQ3_S:
  case GGML_FTYPE_MOSTLY_IQ2_S:
  case GGML_FTYPE_MOSTLY_IQ4_XS:
  case GGML_FTYPE_MOSTLY_IQ1_M:
  case GGML_FTYPE_MOSTLY_BF16:
    fprintf(_stderr,"%s: invalid model type %d\n","ggml_common_quantize_0",(ulong)(uint)ftype);
    return false;
  }
  cVar6 = ggml_is_quantized(local_158);
  pFVar15 = _stderr;
  if (cVar6 == '\0') {
    uVar10 = ggml_type_name(local_158);
    uVar19 = 0;
    fprintf(pFVar15,"%s: invalid quantization type %d (%s)\n","ggml_common_quantize_0",
            (ulong)(uint)local_158,uVar10);
  }
  else {
    work.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    work.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    work.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_f16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data_f16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data_f16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data_f32.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    data_f32.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    data_f32.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar14 = 0;
    lVar22 = 0;
    local_138 = finp;
    while( true ) {
      std::istream::read((char *)finp,(long)&n_dims);
      std::istream::read((char *)finp,(long)&length);
      std::istream::read((char *)finp,(long)&ttype);
      uVar12 = CONCAT71((int7)((ulong)*(long *)(*(long *)finp + -0x18) >> 8),
                        finp[*(long *)(*(long *)finp + -0x18) + 0x20]) & 0xffffffffffffff02;
      bVar7 = (byte)uVar12 >> 1;
      local_13c = (undefined4)CONCAT71((int7)(uVar12 >> 8),bVar7);
      if (bVar7 != 0) break;
      ne[0] = 1;
      ne[1] = 1;
      ne[2] = 1;
      ne[3] = 1;
      piVar11 = ne;
      uVar21 = 1;
      for (lVar16 = 0; lVar16 < n_dims; lVar16 = lVar16 + 1) {
        std::istream::read((char *)finp,(long)piVar11);
        uVar21 = uVar21 * *piVar11;
        piVar11 = piVar11 + 1;
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct((ulong)&name,(char)length);
      std::istream::read((char *)finp,(long)name._M_dataplus._M_p);
      _Var5 = name._M_dataplus;
      uVar4 = ne._8_8_;
      uVar10 = ne._0_8_;
      uVar12 = (ulong)ne._0_8_ >> 0x20;
      uVar9 = ggml_type_name(ttype);
      printf("%64s - [%5d, %5d, %5d], type = %6s ",_Var5._M_p,uVar10 & 0xffffffff,uVar12,
             uVar4 & 0xffffffff,uVar9);
      __s = (to_quant->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (to_quant->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (__s == pbVar2) {
          local_12c = 0;
          goto LAB_00108141;
        }
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,__s,0x10);
        bVar8 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&name,&local_50,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
        __s = __s + 1;
      } while (!bVar8);
      local_12c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
LAB_00108141:
      __s_00 = (to_skip->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (to_skip->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar20 = local_12c;
        if (__s_00 == pbVar3) goto LAB_00108195;
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,__s_00,0x10);
        bVar8 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&name,&local_50,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
        __s_00 = __s_00 + 1;
      } while (!bVar8);
      uVar20 = 0;
LAB_00108195:
      uVar1 = ttype;
      pFVar15 = _stderr;
      bVar8 = n_dims == 2;
      bVar23 = (char)uVar20 != '\0';
      __new_size = (size_type)(int)uVar21;
      if (bVar23 && bVar8) {
        if ((uint)ttype < 2) {
          if (ttype == 1) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      (&data_f16,__new_size);
            std::istream::read((char *)local_138,
                               (long)data_f16.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            std::vector<float,_std::allocator<float>_>::resize(&data_f32,__new_size);
            uVar12 = 0;
            if (0 < (int)uVar21) {
              uVar12 = (ulong)uVar21;
            }
            for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
              fVar24 = (float)ggml_fp16_to_fp32(data_f16.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar17]);
              data_f32.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = fVar24;
            }
          }
          else {
            std::vector<float,_std::allocator<float>_>::resize(&data_f32,__new_size);
            std::istream::read((char *)local_138,
                               (long)data_f32.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
          }
          ttype = local_158;
          goto LAB_00108299;
        }
        uVar10 = ggml_type_name(ttype);
        __format = "%s: unsupported ttype %d (%s) for integer quantization\n";
LAB_00108661:
        fprintf(pFVar15,__format,"ggml_common_quantize_0",(ulong)uVar1,uVar10);
        uVar20 = local_13c;
        std::__cxx11::string::~string((string *)&name);
        goto LAB_00108572;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data_u8,(long)(int)(uVar21 << (ttype == 0) + 1));
      std::istream::read((char *)local_138,
                         (long)data_u8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
LAB_00108299:
      std::ostream::write((char *)local_148,(long)&n_dims);
      std::ostream::write((char *)local_148,(long)&length);
      std::ostream::write((char *)local_148,(long)&ttype);
      piVar13 = ne;
      for (lVar16 = 0; lVar16 < n_dims; lVar16 = lVar16 + 1) {
        std::ostream::write((char *)local_148,(long)piVar13);
        piVar13 = piVar13 + 1;
      }
      std::ostream::write((char *)local_148,(long)name._M_dataplus._M_p);
      if (bVar23 && bVar8) {
        std::vector<float,_std::allocator<float>_>::resize(&work,__new_size);
        finp = local_138;
        uVar1 = ttype;
        pFVar15 = _stderr;
        uVar12 = (ulong)(uint)ttype;
        if (uVar12 < 0x28) {
          if ((0x7dccUL >> (uVar12 & 0x3f) & 1) == 0) {
            lVar16 = 0;
            if ((0x8c7fff8203U >> (uVar12 & 0x3f) & 1) != 0) {
              uVar10 = ggml_type_name(uVar12);
              __format = "%s: unsupported quantization type %d (%s)\n";
              goto LAB_00108661;
            }
          }
          else {
            lVar16 = ggml_quantize_chunk(uVar12,data_f32.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                         work.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start,0,
                                         (long)((int)uVar21 / ne[0]),(long)ne[0],0);
          }
        }
        else {
          lVar16 = 0;
        }
        std::ostream::write((char *)local_148,
                            (long)work.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        lVar18 = __new_size << 2;
        auVar26._8_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar26._0_8_ = lVar18;
        auVar26._12_4_ = 0x45300000;
        auVar29._8_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar29._0_8_ = lVar16;
        auVar29._12_4_ = 0x45300000;
        printf("size = %8.2f MB -> %8.2f MB\n",
               SUB84(((auVar26._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) * 0.0009765625
                     * 0.0009765625,0),
               ((auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625);
      }
      else {
        lVar16 = (long)data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        auVar25._8_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar25._0_8_ = lVar16;
        auVar25._12_4_ = 0x45300000;
        printf("size = %8.3f MB\n",
               SUB84(((auVar25._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.0009765625
                     * 0.0009765625,0));
        std::ostream::write((char *)local_148,
                            (long)data_u8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        lVar16 = (long)data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        finp = local_138;
      }
      lVar14 = lVar14 + lVar16;
      lVar22 = lVar22 + __new_size * 4;
      std::__cxx11::string::~string((string *)&name);
    }
    auVar27._8_4_ = (int)((ulong)lVar22 >> 0x20);
    auVar27._0_8_ = lVar22;
    auVar27._12_4_ = 0x45300000;
    printf("%s: model size  = %8.2f MB\n",
           SUB84(((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625,0),"ggml_common_quantize_0");
    uVar10 = ggml_type_name(local_158);
    auVar28._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar28._0_8_ = lVar14;
    auVar28._12_4_ = 0x45300000;
    printf("%s: quant size  = %8.2f MB | ftype = %d (%s)\n",
           SUB84(((auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625,0),"ggml_common_quantize_0",(ulong)(uint)ftype,uVar10);
    uVar20 = local_13c;
LAB_00108572:
    uVar19 = (undefined1)uVar20;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&data_f32.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&data_f16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data_u8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&work.super__Vector_base<float,_std::allocator<float>_>);
  }
  return (bool)uVar19;
}

Assistant:

bool ggml_common_quantize_0(
        std::ifstream & finp,
        std::ofstream & fout,
        const ggml_ftype ftype,
        const std::vector<std::string> & to_quant,
        const std::vector<std::string> & to_skip) {

    ggml_type qtype = GGML_TYPE_F32;

    switch (ftype) {
        case GGML_FTYPE_MOSTLY_Q4_0: qtype = GGML_TYPE_Q4_0; break;
        case GGML_FTYPE_MOSTLY_Q4_1: qtype = GGML_TYPE_Q4_1; break;
        case GGML_FTYPE_MOSTLY_Q5_0: qtype = GGML_TYPE_Q5_0; break;
        case GGML_FTYPE_MOSTLY_Q5_1: qtype = GGML_TYPE_Q5_1; break;
        case GGML_FTYPE_MOSTLY_Q8_0: qtype = GGML_TYPE_Q8_0; break;
        case GGML_FTYPE_MOSTLY_Q2_K: qtype = GGML_TYPE_Q2_K; break;
        case GGML_FTYPE_MOSTLY_Q3_K: qtype = GGML_TYPE_Q3_K; break;
        case GGML_FTYPE_MOSTLY_Q4_K: qtype = GGML_TYPE_Q4_K; break;
        case GGML_FTYPE_MOSTLY_Q5_K: qtype = GGML_TYPE_Q5_K; break;
        case GGML_FTYPE_MOSTLY_Q6_K: qtype = GGML_TYPE_Q6_K; break;
        case GGML_FTYPE_UNKNOWN:
        case GGML_FTYPE_ALL_F32:
        case GGML_FTYPE_MOSTLY_F16:
        case GGML_FTYPE_MOSTLY_Q4_1_SOME_F16:
        case GGML_FTYPE_MOSTLY_IQ2_XXS:
        case GGML_FTYPE_MOSTLY_IQ2_XS:
        case GGML_FTYPE_MOSTLY_IQ2_S:
        case GGML_FTYPE_MOSTLY_IQ3_XXS:
        case GGML_FTYPE_MOSTLY_IQ3_S:
        case GGML_FTYPE_MOSTLY_IQ1_S:
        case GGML_FTYPE_MOSTLY_IQ4_NL:
        case GGML_FTYPE_MOSTLY_IQ4_XS:
        case GGML_FTYPE_MOSTLY_IQ1_M:
        case GGML_FTYPE_MOSTLY_BF16:
                {
                    fprintf(stderr, "%s: invalid model type %d\n", __func__, ftype);
                    return false;
                }
    };

    if (!ggml_is_quantized(qtype)) {
        fprintf(stderr, "%s: invalid quantization type %d (%s)\n", __func__, qtype, ggml_type_name(qtype));
        return false;
    }

    size_t total_size_org = 0;
    size_t total_size_new = 0;

    std::vector<float> work;

    std::vector<uint8_t>     data_u8;
    std::vector<ggml_fp16_t> data_f16;
    std::vector<float>       data_f32;

    while (true) {
        int32_t n_dims;
        int32_t length;
        int32_t ttype;

        finp.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
        finp.read(reinterpret_cast<char *>(&length), sizeof(length));
        finp.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

        if (finp.eof()) {
            break;
        }

        int32_t nelements = 1;
        int32_t ne[4] = { 1, 1, 1, 1 };
        for (int i = 0; i < n_dims; ++i) {
            finp.read (reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
            nelements *= ne[i];
        }

        std::string name(length, 0);
        finp.read (&name[0], length);

        printf("%64s - [%5d, %5d, %5d], type = %6s ", name.data(), ne[0], ne[1], ne[2], ggml_type_name((ggml_type) ttype));

        bool quantize = false;

        // check if we should quantize this tensor
        for (const auto & s : to_quant) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = true;
                break;
            }
        }

        // check if we should skip this tensor
        for (const auto & s : to_skip) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = false;
                break;
            }
        }

        // quantize only 2D tensors
        quantize &= (n_dims == 2);

        if (quantize) {
            if (ttype != GGML_TYPE_F32 && ttype != GGML_TYPE_F16) {
                fprintf(stderr, "%s: unsupported ttype %d (%s) for integer quantization\n", __func__, ttype, ggml_type_name((ggml_type) ttype));
                return false;
            }

            if (ttype == GGML_TYPE_F16) {
                data_f16.resize(nelements);
                finp.read(reinterpret_cast<char *>(data_f16.data()), nelements * sizeof(ggml_fp16_t));
                data_f32.resize(nelements);
                for (int i = 0; i < nelements; ++i) {
                    data_f32[i] = ggml_fp16_to_fp32(data_f16[i]);
                }
            } else {
                data_f32.resize(nelements);
                finp.read(reinterpret_cast<char *>(data_f32.data()), nelements * sizeof(float));
            }

            ttype = qtype;
        } else {
            const int bpe = (ttype == 0) ? sizeof(float) : sizeof(uint16_t);

            data_u8.resize(nelements*bpe);
            finp.read(reinterpret_cast<char *>(data_u8.data()), nelements * bpe);
        }

        fout.write(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
        fout.write(reinterpret_cast<char *>(&length), sizeof(length));
        fout.write(reinterpret_cast<char *>(&ttype),  sizeof(ttype));
        for (int i = 0; i < n_dims; ++i) {
            fout.write(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
        }
        fout.write(&name[0], length);

        if (quantize) {
            work.resize(nelements); // for quantization

            size_t cur_size = 0;
            switch ((ggml_type) ttype) {
                case GGML_TYPE_Q4_0:
                case GGML_TYPE_Q4_1:
                case GGML_TYPE_Q5_0:
                case GGML_TYPE_Q5_1:
                case GGML_TYPE_Q8_0:
                case GGML_TYPE_Q2_K:
                case GGML_TYPE_Q3_K:
                case GGML_TYPE_Q4_K:
                case GGML_TYPE_Q5_K:
                case GGML_TYPE_Q6_K:
                    {
                        cur_size = ggml_quantize_chunk((ggml_type) ttype, data_f32.data(), work.data(), 0, nelements/ne[0], ne[0], nullptr);
                    } break;
                case GGML_TYPE_F32:
                case GGML_TYPE_F16:
                case GGML_TYPE_I8:
                case GGML_TYPE_I16:
                case GGML_TYPE_I32:
                case GGML_TYPE_I64:
                case GGML_TYPE_F64:
                case GGML_TYPE_Q8_1:
                case GGML_TYPE_Q8_K:
                case GGML_TYPE_IQ2_XXS:
                case GGML_TYPE_IQ2_XS:
                case GGML_TYPE_IQ2_S:
                case GGML_TYPE_IQ3_XXS:
                case GGML_TYPE_IQ3_S:
                case GGML_TYPE_IQ1_S:
                case GGML_TYPE_IQ4_NL:
                case GGML_TYPE_IQ4_XS:
                case GGML_TYPE_IQ1_M:
                case GGML_TYPE_BF16:
                case GGML_TYPE_TQ1_0:
                case GGML_TYPE_TQ2_0:
                case GGML_TYPE_COUNT:
                    {
                        fprintf(stderr, "%s: unsupported quantization type %d (%s)\n", __func__, ttype, ggml_type_name((ggml_type) ttype));
                        return false;
                    }
            }

            fout.write(reinterpret_cast<char *>(work.data()), cur_size);
            total_size_new += cur_size;

            printf("size = %8.2f MB -> %8.2f MB\n", nelements * sizeof(float)/1024.0/1024.0, cur_size/1024.0/1024.0);
        } else {
            printf("size = %8.3f MB\n", data_u8.size()/1024.0/1024.0);
            fout.write(reinterpret_cast<char *>(data_u8.data()), data_u8.size());
            total_size_new += data_u8.size();
        }

        total_size_org += nelements * sizeof(float);
    }

    printf("%s: model size  = %8.2f MB\n", __func__, total_size_org/1024.0/1024.0);
    printf("%s: quant size  = %8.2f MB | ftype = %d (%s)\n", __func__, total_size_new/1024.0/1024.0, ftype, ggml_type_name(qtype));

    return true;
}